

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getFinalAddress<wasm::Load>
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Load *curr,Literal *ptr,Index bytes,
          Address memorySize)

{
  int32_t iVar1;
  uint64_t rhs;
  uint64_t lhs;
  Address addr;
  
  if ((ptr->type).id == 2) {
    iVar1 = Literal::geti32(ptr);
    lhs = (uint64_t)iVar1;
  }
  else {
    lhs = Literal::geti64(ptr);
  }
  rhs = memorySize.addr * 0x10000;
  trapIfGt(this,(curr->offset).addr,rhs,"offset > memory");
  trapIfGt(this,lhs,rhs - (curr->offset).addr,"final > memory");
  addr.addr = lhs + (curr->offset).addr;
  trapIfGt(this,(ulong)bytes,rhs,"bytes > memory");
  checkLoadAddress(this,addr,bytes,memorySize);
  return (Address)addr.addr;
}

Assistant:

Address
  getFinalAddress(LS* curr, Literal ptr, Index bytes, Address memorySize) {
    Address memorySizeBytes = memorySize * Memory::kPageSize;
    uint64_t addr = ptr.type == Type::i32 ? ptr.geti32() : ptr.geti64();
    trapIfGt(curr->offset, memorySizeBytes, "offset > memory");
    trapIfGt(addr, memorySizeBytes - curr->offset, "final > memory");
    addr += curr->offset;
    trapIfGt(bytes, memorySizeBytes, "bytes > memory");
    checkLoadAddress(addr, bytes, memorySize);
    return addr;
  }